

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall CPU::fetch(CPU *this)

{
  uint32_t uVar1;
  ostream *poVar2;
  CPU *this_local;
  
  (this->iqueue).insn_addr = this->pc;
  uVar1 = get_insn(this,this->pc);
  (this->iqueue).insn = uVar1;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->iqueue).insn);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int CPU::fetch()
{
	iqueue.insn_addr = pc;
	iqueue.insn = get_insn(pc);
	cout<<hex<<iqueue.insn<<endl;
	return 0;
}